

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_php_generator.cc
# Opt level: O0

void __thiscall t_php_generator::generate_service_rest(t_php_generator *this,t_service *tservice)

{
  undefined8 uVar1;
  bool bVar2;
  int iVar3;
  uint uVar4;
  char *pcVar5;
  t_service *ptVar6;
  t_program *ptVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  ostream *poVar8;
  ulong uVar9;
  vector<t_function_*,_std::allocator<t_function_*>_> *__x;
  reference pptVar10;
  string *psVar11;
  t_struct *ptVar12;
  reference pptVar13;
  t_type *type;
  t_base_type *this_00;
  undefined4 extraout_var_01;
  int __oflag;
  string local_460;
  string local_440;
  string local_420;
  string local_400;
  string local_3e0;
  string local_3c0;
  string local_3a0;
  string local_380;
  string local_360;
  string local_340;
  string local_320;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_300;
  undefined1 local_2e0 [8];
  string req;
  string cast;
  t_type *atype;
  t_field **local_290;
  __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_> local_288
  ;
  const_iterator a_iter;
  vector<t_field_*,_std::allocator<t_field_*>_> *args;
  t_function **local_270;
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
  local_268;
  iterator f_iter;
  vector<t_function_*,_std::allocator<t_function_*>_> functions;
  string local_228;
  string local_208;
  string local_1e8;
  string local_1c8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_188;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_168;
  string local_148;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_128;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_108;
  allocator local_e1;
  string local_e0 [8];
  string extends_if;
  string local_b8 [8];
  string extends;
  string local_90 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_60;
  undefined1 local_40 [8];
  string f_service_rest_name;
  ofstream_with_content_based_conditional_update *f_service_rest;
  t_service *tservice_local;
  t_php_generator *this_local;
  
  f_service_rest_name.field_2._8_8_ = &this->f_service_;
  if ((this->classmap_ & 1U) == 0) {
    std::operator+(&local_60,&this->package_dir_,
                   &(this->super_t_oop_generator).super_t_generator.service_name_);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_40,
                   &local_60,"Rest.php");
    std::__cxx11::string::~string((string *)&local_60);
    uVar1 = f_service_rest_name.field_2._8_8_;
    pcVar5 = (char *)std::__cxx11::string::c_str();
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_90,pcVar5,(allocator *)(extends.field_2._M_local_buf + 0xf));
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::open
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)uVar1,(char *)local_90,__oflag);
    std::__cxx11::string::~string(local_90);
    std::allocator<char>::~allocator((allocator<char> *)(extends.field_2._M_local_buf + 0xf));
    generate_service_header(this,tservice,(ostream *)f_service_rest_name.field_2._8_8_);
    std::__cxx11::string::~string((string *)local_40);
  }
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_b8,"",(allocator *)(extends_if.field_2._M_local_buf + 0xf));
  std::allocator<char>::~allocator((allocator<char> *)(extends_if.field_2._M_local_buf + 0xf));
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_e0,"",&local_e1);
  std::allocator<char>::~allocator((allocator<char> *)&local_e1);
  ptVar6 = t_service::get_extends(tservice);
  if (ptVar6 != (t_service *)0x0) {
    ptVar6 = t_service::get_extends(tservice);
    ptVar7 = t_type::get_program(&ptVar6->super_t_type);
    php_namespace_abi_cxx11_(&local_148,this,ptVar7);
    std::operator+(&local_128," extends ",&local_148);
    ptVar6 = t_service::get_extends(tservice);
    iVar3 = (*(ptVar6->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_108,&local_128,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var,iVar3));
    std::__cxx11::string::operator=(local_b8,(string *)&local_108);
    std::__cxx11::string::~string((string *)&local_108);
    std::__cxx11::string::~string((string *)&local_128);
    std::__cxx11::string::~string((string *)&local_148);
    ptVar6 = t_service::get_extends(tservice);
    ptVar7 = t_type::get_program(&ptVar6->super_t_type);
    php_namespace_abi_cxx11_(&local_1c8,this,ptVar7);
    std::operator+(&local_1a8," extends ",&local_1c8);
    ptVar6 = t_service::get_extends(tservice);
    iVar3 = (*(ptVar6->super_t_type).super_t_doc._vptr_t_doc[3])();
    std::operator+(&local_188,&local_1a8,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   CONCAT44(extraout_var_00,iVar3));
    std::operator+(&local_168,&local_188,"Rest");
    std::__cxx11::string::operator=(local_e0,(string *)&local_168);
    std::__cxx11::string::~string((string *)&local_168);
    std::__cxx11::string::~string((string *)&local_188);
    std::__cxx11::string::~string((string *)&local_1a8);
    std::__cxx11::string::~string((string *)&local_1c8);
  }
  poVar8 = std::operator<<((ostream *)f_service_rest_name.field_2._8_8_,"class ");
  poVar8 = std::operator<<(poVar8,(string *)
                                  &(this->super_t_oop_generator).super_t_generator.service_name_);
  poVar8 = std::operator<<(poVar8,"Rest");
  poVar8 = std::operator<<(poVar8,local_e0);
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  poVar8 = std::operator<<(poVar8,"{");
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_up((t_generator *)this);
  uVar9 = std::__cxx11::string::empty();
  uVar1 = f_service_rest_name.field_2._8_8_;
  if ((uVar9 & 1) != 0) {
    t_generator::indent_abi_cxx11_(&local_1e8,(t_generator *)this);
    poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_1e8);
    poVar8 = std::operator<<(poVar8,"protected $impl_;");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_1e8);
  }
  uVar1 = f_service_rest_name.field_2._8_8_;
  t_generator::indent_abi_cxx11_(&local_208,(t_generator *)this);
  poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_208);
  poVar8 = std::operator<<(poVar8,"public function __construct($impl) {");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_(&local_228,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)&local_228);
  poVar8 = std::operator<<(poVar8,"  $this->impl_ = $impl;");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  t_generator::indent_abi_cxx11_
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage,(t_generator *)this);
  poVar8 = std::operator<<(poVar8,(string *)
                                  &functions.
                                   super__Vector_base<t_function_*,_std::allocator<t_function_*>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage);
  poVar8 = std::operator<<(poVar8,"}");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::__cxx11::string::~string
            ((string *)
             &functions.super__Vector_base<t_function_*,_std::allocator<t_function_*>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&local_208);
  __x = t_service::get_functions(tservice);
  std::vector<t_function_*,_std::allocator<t_function_*>_>::vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter,__x);
  __gnu_cxx::
  __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
  __normal_iterator(&local_268);
  local_270 = (t_function **)
              std::vector<t_function_*,_std::allocator<t_function_*>_>::begin
                        ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  local_268._M_current = local_270;
  while( true ) {
    args = (vector<t_field_*,_std::allocator<t_field_*>_> *)
           std::vector<t_function_*,_std::allocator<t_function_*>_>::end
                     ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
    bVar2 = __gnu_cxx::operator!=
                      (&local_268,
                       (__normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
                        *)&args);
    if (!bVar2) break;
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)f_service_rest_name.field_2._8_8_);
    poVar8 = std::operator<<(poVar8,"public function ");
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_268);
    psVar11 = t_function::get_name_abi_cxx11_(*pptVar10);
    poVar8 = std::operator<<(poVar8,(string *)psVar11);
    poVar8 = std::operator<<(poVar8,"($request) {");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    t_generator::indent_up((t_generator *)this);
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_268);
    ptVar12 = t_function::get_arglist(*pptVar10);
    a_iter._M_current = (t_field **)t_struct::get_members(ptVar12);
    __gnu_cxx::
    __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
    __normal_iterator(&local_288);
    local_290 = (t_field **)
                std::vector<t_field_*,_std::allocator<t_field_*>_>::begin(a_iter._M_current);
    local_288._M_current = local_290;
    while( true ) {
      atype = (t_type *)
              std::vector<t_field_*,_std::allocator<t_field_*>_>::end
                        ((vector<t_field_*,_std::allocator<t_field_*>_> *)a_iter._M_current);
      bVar2 = __gnu_cxx::operator!=
                        (&local_288,
                         (__normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                          *)&atype);
      uVar1 = f_service_rest_name.field_2._8_8_;
      if (!bVar2) break;
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_288);
      type = t_field::get_type(*pptVar13);
      this_00 = (t_base_type *)t_generator::get_true_type(type);
      type_to_cast_abi_cxx11_((string *)((long)&req.field_2 + 8),this,(t_type *)this_00);
      pptVar13 = __gnu_cxx::
                 __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                 ::operator*(&local_288);
      psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
      std::operator+(&local_300,"$request[\'",psVar11);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2e0,
                     &local_300,"\']");
      std::__cxx11::string::~string((string *)&local_300);
      uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[8])();
      uVar1 = f_service_rest_name.field_2._8_8_;
      if ((uVar4 & 1) == 0) {
        t_generator::indent_abi_cxx11_(&local_340,(t_generator *)this);
        poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_340);
        poVar8 = std::operator<<(poVar8,"$");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_288);
        psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar8 = std::operator<<(poVar8,(string *)psVar11);
        poVar8 = std::operator<<(poVar8," = isset(");
        poVar8 = std::operator<<(poVar8,(string *)local_2e0);
        poVar8 = std::operator<<(poVar8,") ? ");
        poVar8 = std::operator<<(poVar8,(string *)(req.field_2._M_local_buf + 8));
        poVar8 = std::operator<<(poVar8,(string *)local_2e0);
        poVar8 = std::operator<<(poVar8," : null;");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_340);
      }
      else {
        t_generator::indent_abi_cxx11_(&local_320,(t_generator *)this);
        poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_320);
        poVar8 = std::operator<<(poVar8,"$");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_288);
        psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar8 = std::operator<<(poVar8,(string *)psVar11);
        poVar8 = std::operator<<(poVar8," = ");
        poVar8 = std::operator<<(poVar8,(string *)(req.field_2._M_local_buf + 8));
        poVar8 = std::operator<<(poVar8,"(!empty(");
        poVar8 = std::operator<<(poVar8,(string *)local_2e0);
        poVar8 = std::operator<<(poVar8,") && (");
        poVar8 = std::operator<<(poVar8,(string *)local_2e0);
        poVar8 = std::operator<<(poVar8," !== \'false\'));");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_320);
      }
      uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[6])();
      if (((uVar4 & 1) == 0) ||
         (bVar2 = t_base_type::is_string_list(this_00), uVar1 = f_service_rest_name.field_2._8_8_,
         !bVar2)) {
        uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0x10])();
        if (((uVar4 & 1) == 0) &&
           (uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xe])(), (uVar4 & 1) == 0)) {
          uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xf])();
          uVar1 = f_service_rest_name.field_2._8_8_;
          if ((uVar4 & 1) == 0) {
            uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xb])();
            if (((uVar4 & 1) != 0) ||
               (uVar4 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[0xc])(), (uVar4 & 1) != 0)
               ) {
              uVar1 = f_service_rest_name.field_2._8_8_;
              t_generator::indent_abi_cxx11_(&local_3c0,(t_generator *)this);
              poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_3c0);
              poVar8 = std::operator<<(poVar8,"if ($");
              pptVar13 = __gnu_cxx::
                         __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                         ::operator*(&local_288);
              psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
              poVar8 = std::operator<<(poVar8,(string *)psVar11);
              poVar8 = std::operator<<(poVar8," !== null) {");
              poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
              t_generator::indent_abi_cxx11_(&local_3e0,(t_generator *)this);
              poVar8 = std::operator<<(poVar8,(string *)&local_3e0);
              poVar8 = std::operator<<(poVar8,"  $");
              pptVar13 = __gnu_cxx::
                         __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                         ::operator*(&local_288);
              psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
              poVar8 = std::operator<<(poVar8,(string *)psVar11);
              poVar8 = std::operator<<(poVar8," = new ");
              ptVar7 = t_type::get_program((t_type *)this_00);
              php_namespace_abi_cxx11_(&local_400,this,ptVar7);
              poVar8 = std::operator<<(poVar8,(string *)&local_400);
              iVar3 = (*(this_00->super_t_type).super_t_doc._vptr_t_doc[3])();
              poVar8 = std::operator<<(poVar8,(string *)CONCAT44(extraout_var_01,iVar3));
              poVar8 = std::operator<<(poVar8,"(json_decode($");
              pptVar13 = __gnu_cxx::
                         __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                         ::operator*(&local_288);
              psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
              poVar8 = std::operator<<(poVar8,(string *)psVar11);
              poVar8 = std::operator<<(poVar8,", true));");
              poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
              t_generator::indent_abi_cxx11_(&local_420,(t_generator *)this);
              poVar8 = std::operator<<(poVar8,(string *)&local_420);
              poVar8 = std::operator<<(poVar8,"}");
              std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
              std::__cxx11::string::~string((string *)&local_420);
              std::__cxx11::string::~string((string *)&local_400);
              std::__cxx11::string::~string((string *)&local_3e0);
              std::__cxx11::string::~string((string *)&local_3c0);
            }
          }
          else {
            t_generator::indent_abi_cxx11_(&local_3a0,(t_generator *)this);
            poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_3a0);
            poVar8 = std::operator<<(poVar8,"$");
            pptVar13 = __gnu_cxx::
                       __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       ::operator*(&local_288);
            psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
            poVar8 = std::operator<<(poVar8,(string *)psVar11);
            poVar8 = std::operator<<(poVar8," = array_fill_keys(json_decode($");
            pptVar13 = __gnu_cxx::
                       __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                       ::operator*(&local_288);
            psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
            poVar8 = std::operator<<(poVar8,(string *)psVar11);
            poVar8 = std::operator<<(poVar8,", true), 1);");
            std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
            std::__cxx11::string::~string((string *)&local_3a0);
          }
        }
        else {
          uVar1 = f_service_rest_name.field_2._8_8_;
          t_generator::indent_abi_cxx11_(&local_380,(t_generator *)this);
          poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_380);
          poVar8 = std::operator<<(poVar8,"$");
          pptVar13 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_288);
          psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
          poVar8 = std::operator<<(poVar8,(string *)psVar11);
          poVar8 = std::operator<<(poVar8," = json_decode($");
          pptVar13 = __gnu_cxx::
                     __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                     ::operator*(&local_288);
          psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
          poVar8 = std::operator<<(poVar8,(string *)psVar11);
          poVar8 = std::operator<<(poVar8,", true);");
          std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
          std::__cxx11::string::~string((string *)&local_380);
        }
      }
      else {
        t_generator::indent_abi_cxx11_(&local_360,(t_generator *)this);
        poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_360);
        poVar8 = std::operator<<(poVar8,"$");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_288);
        psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar8 = std::operator<<(poVar8,(string *)psVar11);
        poVar8 = std::operator<<(poVar8," = explode(\',\', $");
        pptVar13 = __gnu_cxx::
                   __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>
                   ::operator*(&local_288);
        psVar11 = t_field::get_name_abi_cxx11_(*pptVar13);
        poVar8 = std::operator<<(poVar8,(string *)psVar11);
        poVar8 = std::operator<<(poVar8,");");
        std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
        std::__cxx11::string::~string((string *)&local_360);
      }
      std::__cxx11::string::~string((string *)local_2e0);
      std::__cxx11::string::~string((string *)(req.field_2._M_local_buf + 8));
      __gnu_cxx::
      __normal_iterator<t_field_*const_*,_std::vector<t_field_*,_std::allocator<t_field_*>_>_>::
      operator++(&local_288);
    }
    t_generator::indent_abi_cxx11_(&local_440,(t_generator *)this);
    poVar8 = std::operator<<((ostream *)uVar1,(string *)&local_440);
    poVar8 = std::operator<<(poVar8,"return $this->impl_->");
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_268);
    psVar11 = t_function::get_name_abi_cxx11_(*pptVar10);
    poVar8 = std::operator<<(poVar8,(string *)psVar11);
    poVar8 = std::operator<<(poVar8,"(");
    pptVar10 = __gnu_cxx::
               __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>
               ::operator*(&local_268);
    ptVar12 = t_function::get_arglist(*pptVar10);
    argument_list_abi_cxx11_(&local_460,this,ptVar12,false);
    poVar8 = std::operator<<(poVar8,(string *)&local_460);
    poVar8 = std::operator<<(poVar8,");");
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::__cxx11::string::~string((string *)&local_460);
    std::__cxx11::string::~string((string *)&local_440);
    t_generator::indent_down((t_generator *)this);
    poVar8 = t_generator::indent((t_generator *)this,(ostream *)f_service_rest_name.field_2._8_8_);
    poVar8 = std::operator<<(poVar8,"}");
    poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
    __gnu_cxx::
    __normal_iterator<t_function_**,_std::vector<t_function_*,_std::allocator<t_function_*>_>_>::
    operator++(&local_268);
  }
  t_generator::indent_down((t_generator *)this);
  poVar8 = std::operator<<((ostream *)f_service_rest_name.field_2._8_8_,"}");
  poVar8 = std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  std::operator<<(poVar8,(string *)&::endl_abi_cxx11_);
  iVar3 = 0x56c218;
  std::operator<<((ostream *)f_service_rest_name.field_2._8_8_,(string *)&::endl_abi_cxx11_);
  if ((this->classmap_ & 1U) == 0) {
    template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>::close
              ((template_ofstream_with_content_based_conditional_update<char,_std::char_traits<char>_>
                *)f_service_rest_name.field_2._8_8_,iVar3);
  }
  std::vector<t_function_*,_std::allocator<t_function_*>_>::~vector
            ((vector<t_function_*,_std::allocator<t_function_*>_> *)&f_iter);
  std::__cxx11::string::~string(local_e0);
  std::__cxx11::string::~string(local_b8);
  return;
}

Assistant:

void t_php_generator::generate_service_rest(t_service* tservice) {
  ofstream_with_content_based_conditional_update& f_service_rest = f_service_;
  if (!classmap_) {
    string f_service_rest_name = package_dir_ + service_name_ + "Rest.php";
    f_service_rest.open(f_service_rest_name.c_str());
    generate_service_header(tservice, f_service_rest);
  }

  string extends = "";
  string extends_if = "";
  if (tservice->get_extends() != nullptr) {
    extends = " extends " + php_namespace(tservice->get_extends()->get_program())
              + tservice->get_extends()->get_name();
    extends_if = " extends " + php_namespace(tservice->get_extends()->get_program())
                 + tservice->get_extends()->get_name() + "Rest";
  }
  f_service_rest << "class " << service_name_ << "Rest" << extends_if << endl
                 << "{" << endl;
  indent_up();

  if (extends.empty()) {
    f_service_rest << indent() << "protected $impl_;" << endl << endl;
  }

  f_service_rest << indent() << "public function __construct($impl) {" << endl << indent()
             << "  $this->impl_ = $impl;" << endl << indent() << "}" << endl << endl;

  vector<t_function*> functions = tservice->get_functions();
  vector<t_function*>::iterator f_iter;
  for (f_iter = functions.begin(); f_iter != functions.end(); ++f_iter) {
    indent(f_service_rest) << "public function " << (*f_iter)->get_name() << "($request) {" << endl;
    indent_up();
    const vector<t_field*>& args = (*f_iter)->get_arglist()->get_members();
    vector<t_field*>::const_iterator a_iter;
    for (a_iter = args.begin(); a_iter != args.end(); ++a_iter) {
      t_type* atype = get_true_type((*a_iter)->get_type());
      string cast = type_to_cast(atype);
      string req = "$request['" + (*a_iter)->get_name() + "']";
      if (atype->is_bool()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = " << cast << "(!empty(" << req
                   << ") && (" << req << " !== 'false'));" << endl;
      } else {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = isset(" << req << ") ? "
                   << cast << req << " : null;" << endl;
      }
      if (atype->is_string() && ((t_base_type*)atype)->is_string_list()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = explode(',', $"
                       << (*a_iter)->get_name() << ");" << endl;
      } else if (atype->is_map() || atype->is_list()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = json_decode($"
                       << (*a_iter)->get_name() << ", true);" << endl;
      } else if (atype->is_set()) {
        f_service_rest << indent() << "$" << (*a_iter)->get_name() << " = array_fill_keys(json_decode($"
                       << (*a_iter)->get_name() << ", true), 1);" << endl;
      } else if (atype->is_struct() || atype->is_xception()) {
        f_service_rest << indent() << "if ($" << (*a_iter)->get_name() << " !== null) {" << endl
                       << indent() << "  $" << (*a_iter)->get_name() << " = new "
                       << php_namespace(atype->get_program()) << atype->get_name() << "(json_decode($"
                       << (*a_iter)->get_name() << ", true));" << endl << indent() << "}" << endl;
      }
    }
    f_service_rest << indent() << "return $this->impl_->" << (*f_iter)->get_name() << "("
               << argument_list((*f_iter)->get_arglist(), false) << ");" << endl;
    indent_down();
    indent(f_service_rest) << "}" << endl << endl;
  }
  indent_down();
  f_service_rest << "}" << endl << endl;

  // Close service rest file
  f_service_rest << endl;
  if (!classmap_) {
    f_service_rest.close();
  }
}